

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

void __thiscall
toktxApp::genMipmap(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage,
                   uint32_t layer,uint32_t faceSlice,ktxTexture *texture)

{
  code *pcVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  pointer pIVar10;
  undefined8 uVar11;
  type pIVar12;
  undefined4 extraout_var;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RDI;
  long in_R8;
  ktx_error_code_e ret;
  stringstream message;
  runtime_error *e;
  uint levelHeight;
  uint levelWidth;
  uint32_t glevel;
  unique_ptr<Image,_std::default_delete<Image>_> levelImage;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd80;
  undefined1 local_48 [8];
  uint local_40;
  uint local_30;
  uint local_2c;
  long local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::unique_ptr<Image,std::default_delete<Image>>::unique_ptr<std::default_delete<Image>,void>
            (in_stack_fffffffffffffd80);
  local_2c = 1;
  while( true ) {
    if (*(uint *)(local_20 + 0x34) <= local_2c) {
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(in_stack_fffffffffffffd80);
      return;
    }
    pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118139);
    uVar7 = Image::getWidth(pIVar10);
    local_30 = maximum<unsigned_int>(1,uVar7 >> ((byte)local_2c & 0x1f));
    pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118179);
    uVar7 = Image::getHeight(pIVar10);
    local_40 = maximum<unsigned_int>(1,uVar7 >> ((byte)local_2c & 0x1f));
    pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1181b9);
    uVar3 = local_30;
    uVar2 = local_40;
    uVar11 = std::__cxx11::string::c_str();
    (*pIVar10->_vptr_Image[0x11])
              (*(undefined4 *)(in_RDI + 0x2d8),local_48,pIVar10,(ulong)uVar3,(ulong)uVar2,uVar11,
               (ulong)*(uint *)(in_RDI + 0x2dc));
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              (in_stack_fffffffffffffd80,
               (unique_ptr<Image,_std::default_delete<Image>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(in_stack_fffffffffffffd80);
    if ((*(byte *)(in_RDI + 0x115) & 1) != 0) {
      pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                          ((unique_ptr<Image,_std::default_delete<Image>_> *)0x118363);
      (*pIVar10->_vptr_Image[0x14])();
    }
    uVar6 = local_14;
    uVar5 = local_18;
    lVar4 = local_20;
    uVar2 = local_2c;
    pcVar1 = *(code **)(*(long *)(local_20 + 8) + 0x48);
    pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                        (in_stack_fffffffffffffd80);
    iVar8 = (*pIVar12->_vptr_Image[2])();
    pIVar10 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x11844d);
    iVar9 = (*pIVar10->_vptr_Image[3])();
    in_stack_fffffffffffffd80 =
         (unique_ptr<Image,_std::default_delete<Image>_> *)CONCAT44(extraout_var,iVar9);
    iVar8 = (*pcVar1)(lVar4,uVar2,uVar6,uVar5,iVar8,in_stack_fffffffffffffd80);
    if (iVar8 != 0) break;
    local_2c = local_2c + 1;
    in_stack_fffffffffffffd7c = 0;
  }
  __assert_fail("ret == KTX_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                ,0x4dc,
                "void toktxApp::genMipmap(unique_ptr<Image>, uint32_t, uint32_t, ktxTexture *)");
}

Assistant:

void
toktxApp::genMipmap(unique_ptr<Image> pImage,
                    uint32_t layer, uint32_t faceSlice,
                    ktxTexture* texture)
{
    unique_ptr<Image> levelImage;
    for (uint32_t glevel = 1; glevel < texture->numLevels; glevel++) {
        auto levelWidth = maximum<uint32_t>(1, pImage->getWidth() >> glevel);
        auto levelHeight = maximum<uint32_t>(1, pImage->getHeight() >> glevel);
        try {
            levelImage = pImage->resample(levelWidth, levelHeight,
                                    options.gmopts.filter.c_str(),
                                    options.gmopts.filterScale,
                                    options.gmopts.wrapMode);
        } catch (runtime_error& e) {
            stringstream message;
            message << "Image::resample() failed! " << e.what();
            cant_create_image(message.str());
        }

        if (options.normalize)
            levelImage->normalize();

        MAYBE_UNUSED ktx_error_code_e ret;
        ret = ktxTexture_SetImageFromMemory(texture,
                                      glevel,
                                      layer,
                                      faceSlice,
                                      *levelImage,
                                      levelImage->getByteCount());
        assert(ret == KTX_SUCCESS);
    }
}